

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall
QFutureInterfaceBase::setProgressValueAndText
          (QFutureInterfaceBase *this,int progressValue,QString *progressText)

{
  __pointer_type copy;
  QFutureInterfaceBasePrivate *this_00;
  ProgressData *pPVar1;
  int i;
  QFutureInterfaceBasePrivate *pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QFutureCallOutEvent QStack_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar4 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar4) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar4) goto LAB_001ef039;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_001ef039:
  pQVar2 = this->d;
  pPVar1 = (pQVar2->m_progress).d;
  if (pPVar1 == (ProgressData *)0x0) {
    pPVar1 = (ProgressData *)operator_new(0x20);
    (pPVar1->text).d.ptr = (char16_t *)0x0;
    (pPVar1->text).d.size = 0;
    pPVar1->minimum = 0;
    pPVar1->maximum = 0;
    (pPVar1->text).d.d = (Data *)0x0;
    QScopedPointer<QFutureInterfaceBasePrivate::ProgressData,_QScopedPointerDeleter<QFutureInterfaceBasePrivate::ProgressData>_>
    ::reset(&pQVar2->m_progress,pPVar1);
    pQVar2 = this->d;
    pPVar1 = (pQVar2->m_progress).d;
  }
  if ((((pPVar1->maximum == 0 && pPVar1->minimum == 0) ||
       (progressValue <= pPVar1->maximum && pPVar1->minimum <= progressValue)) &&
      (pQVar2->m_progressValue < progressValue)) &&
     ((((pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i & 0xcU) == 0 &&
      (bVar4 = QFutureInterfaceBasePrivate::internal_updateProgress
                         (pQVar2,progressValue,progressText), bVar4)))) {
    pQVar2 = this->d;
    QFutureCallOutEvent::QFutureCallOutEvent
              (&QStack_68,Progress,pQVar2->m_progressValue,&((pQVar2->m_progress).d)->text);
    if ((pQVar2->outputConnections).d.size != 0) {
      uVar3 = 0;
      do {
        (*(pQVar2->outputConnections).d.ptr[uVar3]->_vptr_QFutureCallOutInterface[2])();
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(pQVar2->outputConnections).d.size);
    }
    QFutureCallOutEvent::~QFutureCallOutEvent(&QStack_68);
  }
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    LOCK();
    copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
    (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
         (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::setProgressValueAndText(int progressValue,
                                                   const QString &progressText)
{
    QMutexLocker locker(&d->m_mutex);
    if (!d->m_progress)
        d->m_progress.reset(new QFutureInterfaceBasePrivate::ProgressData());

    const bool useProgressRange = (d->m_progress->maximum != 0) || (d->m_progress->minimum != 0);
    if (useProgressRange
        && ((progressValue < d->m_progress->minimum) || (progressValue > d->m_progress->maximum))) {
        return;
    }

    if (d->m_progressValue >= progressValue)
        return;

    if (d->state.loadRelaxed() & (Canceled|Finished))
        return;

    if (d->internal_updateProgress(progressValue, progressText)) {
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                           d->m_progressValue,
                                           d->m_progress->text));
    }
}